

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O0

int __thiscall QLocalServer::listen(QLocalServer *this,int __fd,int __n)

{
  bool bVar1;
  uint uVar2;
  QLocalServerPrivate *this_00;
  int __n_00;
  undefined4 in_register_00000034;
  QMessageLogger *this_01;
  long in_FS_OFFSET;
  QLocalServerPrivate *d;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  int __fd_00;
  undefined1 local_29;
  char local_28 [32];
  long local_8;
  
  this_01 = (QMessageLogger *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLocalServer *)0x37ca1f);
  bVar1 = isListening(this);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (this_01,(char *)this_00,(int)((ulong)this >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    QMessageLogger::warning(local_28,"QLocalServer::listen() called when already listening");
    local_29 = 0;
  }
  else {
    QString::clear((QString *)this);
    __fd_00 = (int)this_01;
    QString::clear((QString *)this);
    uVar2 = QLocalServerPrivate::listen(this_00,__fd_00,__n_00);
    if ((uVar2 & 1) == 0) {
      local_29 = 0;
    }
    else {
      local_29 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_29);
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServer::listen(qintptr socketDescriptor)
{
    Q_D(QLocalServer);
    if (isListening()) {
        qWarning("QLocalServer::listen() called when already listening");
        return false;
    }

    d->serverName.clear();
    d->fullServerName.clear();

    if (!d->listen(socketDescriptor)) {
        return false;
    }

    return true;
}